

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O1

bool comparesEqual(QLocale *loc,Language lang)

{
  qsizetype qVar1;
  Type *this;
  QLocaleData *pQVar2;
  QLocalePrivate *pQVar3;
  Int IVar4;
  undefined2 in_register_00000032;
  QLocaleId lid;
  
  if (CONCAT22(in_register_00000032,lang) == 1) {
    pQVar3 = (loc->d).d.ptr;
    IVar4 = DAT_006bf238;
    if (pQVar3->m_data != (QLocaleData *)c_private()::c_locale) {
      return false;
    }
  }
  else {
    lid.script_id = 0;
    lid.territory_id = 0;
    lid.language_id = lang;
    qVar1 = QLocaleData::findLocaleIndex(lid);
    if (locale_data[qVar1].m_language_id == 1) {
      IVar4 = 0;
      if ((__atomic_base<signed_char>)
          QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_defaultLocalePrivate>::guard._q_value.
          super___atomic_base<signed_char>._M_i == -1) {
        this = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_defaultLocalePrivate>_>
               ::instance();
        pQVar3 = (this->d).ptr;
        if ((pQVar3 != (QLocalePrivate *)0x0) &&
           ((pQVar3->ref)._q_value.super___atomic_base<int>._M_i != 1)) {
          QSharedDataPointer<QLocalePrivate>::detach_helper(this);
        }
        IVar4 = (((this->d).ptr)->m_numberOptions).
                super_QFlagsStorageHelper<QLocale::NumberOption,_4>.
                super_QFlagsStorage<QLocale::NumberOption>.i;
      }
      pQVar2 = default_data;
      if (default_data == (QLocaleData *)0x0) {
        systemData((qsizetype *)0x0);
        default_data = &systemLocaleData;
        pQVar2 = default_data;
      }
    }
    else {
      IVar4 = 0;
      pQVar2 = locale_data + qVar1;
    }
    pQVar3 = (loc->d).d.ptr;
    if (pQVar3->m_data != pQVar2) {
      return false;
    }
  }
  return (pQVar3->m_numberOptions).super_QFlagsStorageHelper<QLocale::NumberOption,_4>.
         super_QFlagsStorage<QLocale::NumberOption>.i == IVar4;
}

Assistant:

bool comparesEqual(const QLocale &loc, QLocale::Language lang)
{
    // Keep in sync with findLocalePrivate()!
    auto compareWithPrivate = [&loc](const QLocaleData *data, QLocale::NumberOptions opts)
    {
        return loc.d->m_data == data && loc.d->m_numberOptions == opts;
    };

    if (lang == QLocale::C)
        return compareWithPrivate(c_private()->m_data, c_private()->m_numberOptions);

    qsizetype index = QLocaleData::findLocaleIndex(QLocaleId { lang });
    Q_ASSERT(index >= 0 && index < locale_data_size);
    const QLocaleData *data = locale_data + index;

    QLocale::NumberOptions numberOptions = QLocale::DefaultNumberOptions;

    // If not found, should use default locale:
    if (data->m_language_id == QLocale::C) {
        if (defaultLocalePrivate.exists())
            numberOptions = defaultLocalePrivate->data()->m_numberOptions;
        data = defaultData();
    }
    return compareWithPrivate(data, numberOptions);
}